

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

bool __thiscall
kj::anon_unknown_8::DiskHandle::tryReplaceNode
          (DiskHandle *this,PathPtr path,WriteMode mode,Function<int_(kj::StringPtr)> *tryCreate)

{
  Iface *pIVar1;
  PathPtr finalName;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  undefined8 __name;
  undefined8 unaff_R15;
  StringPtr toPath;
  PathPtr PVar5;
  StringPtr fromPath;
  PathPtr path_local;
  Fault f;
  anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 local_a8;
  Fault f_2;
  anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 local_88;
  String filename;
  Own<kj::Function<int_(kj::StringPtr)>::Iface> local_58;
  Own<kj::Function<int_(kj::StringPtr)>::Iface> local_48;
  
  path_local.parts.size_ = path.parts.size_;
  path_local.parts.ptr = path.parts.ptr;
  if (path_local.parts.size_ == 0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x39c,FAILED,(char *)0x0,"\"can\'t replace self\"",
               (char (*) [19])"can\'t replace self");
    _::Debug::Fault::~Fault(&f);
    return false;
  }
  PathPtr::toString(&filename,&path_local,false);
  if ((mode & CREATE) == 0) {
LAB_0023bbc5:
    finalName.parts.size_ = path_local.parts.size_;
    finalName.parts.ptr = path_local.parts.ptr;
    local_58.disposer = (tryCreate->impl).disposer;
    local_58.ptr = (tryCreate->impl).ptr;
    (tryCreate->impl).ptr = (Iface *)0x0;
    createNamedTemporary
              ((Maybe<kj::String> *)&f_2,this,finalName,mode,
               (Function<int_(kj::StringPtr)> *)&local_58);
    f.exception._0_1_ = (char)f_2.exception;
    if ((char)f_2.exception == '\x01') {
      local_a8.value.content.ptr = local_88.value.content.ptr;
      local_a8.value.content.size_ = local_88.value.content.size_;
      tryCreate = (Function<int_(kj::StringPtr)> *)local_88.value.content.ptr;
      unaff_R15 = local_88.value.content.size_;
    }
    _::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&f_2);
    Own<kj::Function<int_(kj::StringPtr)>::Iface>::dispose(&local_58);
    if ((char)f_2.exception == '\0') {
      unaff_R15 = 0;
    }
    else {
      pcVar4 = "";
      if (filename.content.size_ != 0) {
        pcVar4 = filename.content.ptr;
      }
      toPath.content.size_ = filename.content.size_ + (filename.content.size_ == 0);
      if (unaff_R15 == 0) {
        tryCreate = (Function<int_(kj::StringPtr)> *)0x240547;
      }
      toPath.content.ptr = pcVar4;
      fromPath.content.size_ = unaff_R15 + (ulong)(unaff_R15 == 0);
      fromPath.content.ptr = (char *)tryCreate;
      bVar2 = tryCommitReplacement(this,toPath,(this->fd).fd,fromPath,mode,(int *)0x0);
      unaff_R15 = 1;
      if (!bVar2) {
        do {
          __name = (Function<int_(kj::StringPtr)> *)0x240547;
          if (local_a8.value.content.size_ != 0) {
            __name = local_a8.value.content.ptr;
          }
          unaff_R15 = 0;
          iVar3 = unlinkat((this->fd).fd,(char *)__name,0);
          if (-1 < iVar3) goto LAB_0023bdce;
          iVar3 = _::Debug::getOsErrorNumber(false);
        } while (iVar3 == -1);
        unaff_R15 = 0;
        if ((iVar3 != 0) && (iVar3 != 2)) {
          _::Debug::Fault::Fault<int,kj::String&>
                    (&f_2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x3c8,iVar3,"unlinkat(fd, tempPath, 0)","*tempPath",&local_a8.value);
          _::Debug::Fault::fatal(&f_2);
        }
      }
    }
LAB_0023bdce:
    _::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&f);
    goto LAB_0023be86;
  }
  do {
    pcVar4 = "";
    if (filename.content.size_ != 0) {
      pcVar4 = filename.content.ptr;
    }
    pIVar1 = (tryCreate->impl).ptr;
    iVar3 = (**pIVar1->_vptr_Iface)
                      (pIVar1,pcVar4,filename.content.size_ + (filename.content.size_ == 0));
    unaff_R15 = CONCAT71((int7)((ulong)unaff_R15 >> 8),1);
    if (-1 < iVar3) goto LAB_0023be86;
    iVar3 = _::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 == 0) goto LAB_0023be86;
  if (iVar3 == 2) {
    if (((mode & CREATE_PARENT) != 0) && (path_local.parts.size_ != 0)) {
      PVar5 = PathPtr::parent(&path_local);
      bVar2 = tryMkdir(this,PVar5,CREATE_PARENT|MODIFY|CREATE,true);
      if (bVar2) {
        PVar5.parts.size_ = path_local.parts.size_;
        PVar5.parts.ptr = path_local.parts.ptr;
        local_48.disposer = (tryCreate->impl).disposer;
        local_48.ptr = (tryCreate->impl).ptr;
        (tryCreate->impl).ptr = (Iface *)0x0;
        bVar2 = tryReplaceNode(this,PVar5,mode & ~CREATE_PARENT,
                               (Function<int_(kj::StringPtr)> *)&local_48);
        unaff_R15 = ZEXT18(bVar2);
        Own<kj::Function<int_(kj::StringPtr)>::Iface>::dispose(&local_48);
        goto LAB_0023be86;
      }
    }
LAB_0023be49:
    _::Debug::Fault::Fault<int,kj::PathPtr&>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x3b5,iVar3,"create(path)","path",&path_local);
    _::Debug::Fault::~Fault(&f);
  }
  else {
    if (iVar3 != 0x11) goto LAB_0023be49;
    if ((mode & MODIFY) != 0) goto LAB_0023bbc5;
  }
  unaff_R15 = 0;
LAB_0023be86:
  Array<char>::~Array(&filename.content);
  return SUB81(unaff_R15,0);
}

Assistant:

bool tryReplaceNode(PathPtr path, WriteMode mode, Function<int(StringPtr)> tryCreate) const {
    // Replaces the given path with an object created by calling tryCreate().
    //
    // tryCreate() must behave like a syscall which creates the node at the path passed to it,
    // returning a negative value on error. If the path passed to tryCreate already exists, it
    // MUST fail with EEXIST.
    //
    // When `mode` includes MODIFY, replaceNode() reacts to EEXIST by creating the node in a
    // temporary location and then rename()ing it into place.

    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("can't replace self") { return false; }
    }

    auto filename = path.toString();

    if (has(mode, WriteMode::CREATE)) {
      // First try just cerating the node in-place.
      KJ_SYSCALL_HANDLE_ERRORS(tryCreate(filename)) {
        case EEXIST:
          // Target exists.
          if (has(mode, WriteMode::MODIFY)) {
            // Fall back to MODIFY path, below.
            break;
          } else {
            return false;
          }
        case ENOENT:
          if (has(mode, WriteMode::CREATE_PARENT) && path.size() > 0 &&
              tryMkdir(path.parent(), WriteMode::CREATE | WriteMode::MODIFY |
                                      WriteMode::CREATE_PARENT, true)) {
            // Retry, but make sure we don't try to create the parent again.
            return tryReplaceNode(path, mode - WriteMode::CREATE_PARENT, kj::mv(tryCreate));
          }
          // fallthrough
        default:
          KJ_FAIL_SYSCALL("create(path)", error, path) { return false; }
      } else {
        // Success.
        return true;
      }
    }

    // Either we don't have CREATE mode or the target already exists. We need to perform a
    // replacement instead.

    KJ_IF_MAYBE(tempPath, createNamedTemporary(path, mode, kj::mv(tryCreate))) {
      if (tryCommitReplacement(filename, fd, *tempPath, mode)) {
        return true;
      } else {
        KJ_SYSCALL_HANDLE_ERRORS(unlinkat(fd, tempPath->cStr(), 0)) {
          case ENOENT:
            // meh
            break;
          default:
            KJ_FAIL_SYSCALL("unlinkat(fd, tempPath, 0)", error, *tempPath);
        }
        return false;
      }
    } else {
      // threw, but exceptions are disabled
      return false;
    }
  }